

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QDir *dir)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  totally_ordered_wrapper<QDirPrivate_*> tVar4;
  storage_type *in_RCX;
  storage_type *psVar5;
  long *in_RDX;
  char16_t *begin;
  QDirPrivate *pQVar6;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QByteArrayView ba_04;
  QByteArrayView ba_05;
  QByteArrayView ba_06;
  QByteArrayView ba_07;
  QByteArrayView ba_08;
  QDebugStateSaver save;
  QDebugStateSaver save_1;
  QArrayDataPointer<QString> local_118;
  QString local_100;
  QString local_e8;
  totally_ordered_wrapper<QDirPrivate_*> local_d0;
  QDebug local_c8;
  QDebug local_c0;
  QDebug local_b8;
  QDebugStateSaver local_b0;
  QString local_a8;
  QArrayDataPointer<QString> local_88;
  QString local_68;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_b0,(QDebug *)dir);
  QDebug::resetFormat((QDebug *)dir);
  pQVar6 = (dir->d_ptr).d.ptr;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QDir(";
  QString::fromUtf8(&local_48,(QString *)0x5,ba);
  QTextStream::operator<<((QTextStream *)pQVar6,&local_48);
  piVar3 = (int *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_),2,0x10);
    }
  }
  pQVar6 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar6->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  QFileSystemEntry::filePath(&local_e8,(QFileSystemEntry *)(*in_RDX + 0x30));
  if ((QChar *)local_e8.d.ptr == (QChar *)0x0) {
    local_e8.d.ptr = &QString::_empty;
  }
  QDebug::putString((QDebug *)dir,(QChar *)local_e8.d.ptr,local_e8.d.size);
  pQVar6 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar6->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (dir->d_ptr).d.ptr;
  }
  ba_00.m_data = in_RCX;
  ba_00.m_size = (qsizetype)", nameFilters = {";
  QString::fromUtf8(&local_48,(QString *)0x11,ba_00);
  QTextStream::operator<<((QTextStream *)pQVar6,&local_48);
  piVar3 = (int *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_),2,0x10);
    }
  }
  pQVar6 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar6->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
  }
  lVar2 = *in_RDX;
  local_118.d = *(Data **)(lVar2 + 8);
  local_118.ptr = *(QString **)(lVar2 + 0x10);
  local_118.size = *(qsizetype *)(lVar2 + 0x18);
  if (local_118.d != (Data *)0x0) {
    LOCK();
    ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.d.d._0_2_ = 0x2c;
  psVar5 = (storage_type *)0x1;
  QtPrivate::QStringList_join(&local_100,(QStringList *)&local_118,(QChar *)&local_48,1);
  if ((QChar *)local_100.d.ptr == (QChar *)0x0) {
    local_100.d.ptr = &QString::_empty;
  }
  QDebug::putString((QDebug *)dir,(QChar *)local_100.d.ptr,local_100.d.size);
  pQVar6 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar6->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar6,' ');
    pQVar6 = (dir->d_ptr).d.ptr;
  }
  ba_01.m_data = psVar5;
  ba_01.m_size = (qsizetype)"}, ";
  QString::fromUtf8(&local_48,(QString *)0x3,ba_01);
  QTextStream::operator<<((QTextStream *)pQVar6,&local_48);
  piVar3 = (int *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_),2,0x10);
    }
  }
  local_d0.ptr = (dir->d_ptr).d.ptr;
  if (*(char *)&((local_d0.ptr)->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)local_d0.ptr,' ');
    local_d0.ptr = (dir->d_ptr).d.ptr;
  }
  *(int *)&((local_d0.ptr)->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       *(int *)&((local_d0.ptr)->fileEngine)._M_t.
                super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                ._M_t.
                super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl + 1;
  uVar1 = *(uint *)(*in_RDX + 0x20);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)&local_d0);
  QDebug::resetFormat((QDebug *)&local_d0);
  tVar4.ptr = local_d0.ptr;
  if (uVar1 == 0xffffffff) {
    ba_08.m_data = psVar5;
    ba_08.m_size = (qsizetype)"QDir::SortFlags(NoSort)";
    QString::fromUtf8(&local_48,(QString *)0x17,ba_08);
    QTextStream::operator<<((QTextStream *)tVar4.ptr,&local_48);
    piVar3 = (int *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_),2,0x10)
        ;
      }
    }
    if (*(char *)&((local_d0.ptr)->dirEntry).m_filePath.d.d == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d0.ptr,' ');
    }
  }
  else {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
    psVar5 = "+n\x04";
    other.m_data = &DAT_004c9540 + *(int *)(&DAT_004c9540 + (ulong)(uVar1 & 3) * 4);
    other.m_size = *(qsizetype *)(&DAT_004c9520 + (ulong)(uVar1 & 3) * 8);
    QString::operator=(&local_68,other);
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    if ((uVar1 & 4) != 0) {
      ba_02.m_data = psVar5;
      ba_02.m_size = (qsizetype)"DirsFirst";
      QString::fromLatin1(&local_48,(QString *)0x9,ba_02);
      local_a8.d.d = (Data *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
      local_a8.d.ptr = local_48.d.ptr;
      local_a8.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_a8);
      QList<QString>::end((QList<QString> *)&local_88);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((uVar1 & 0x20) != 0) {
      ba_03.m_data = psVar5;
      ba_03.m_size = (qsizetype)"DirsLast";
      QString::fromLatin1(&local_48,(QString *)0x8,ba_03);
      local_a8.d.d = (Data *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
      local_a8.d.ptr = local_48.d.ptr;
      local_a8.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_a8);
      QList<QString>::end((QList<QString> *)&local_88);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((uVar1 & 0x10) != 0) {
      ba_04.m_data = psVar5;
      ba_04.m_size = (qsizetype)"IgnoreCase";
      QString::fromLatin1(&local_48,(QString *)0xa,ba_04);
      local_a8.d.d = (Data *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
      local_a8.d.ptr = local_48.d.ptr;
      local_a8.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_a8);
      QList<QString>::end((QList<QString> *)&local_88);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((uVar1 & 0x40) != 0) {
      ba_05.m_data = psVar5;
      ba_05.m_size = (qsizetype)"LocaleAware";
      QString::fromLatin1(&local_48,(QString *)0xb,ba_05);
      local_a8.d.d = (Data *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
      local_a8.d.ptr = local_48.d.ptr;
      local_a8.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_a8);
      QList<QString>::end((QList<QString> *)&local_88);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((char)uVar1 < '\0') {
      ba_06.m_data = psVar5;
      ba_06.m_size = (qsizetype)"Type";
      QString::fromLatin1(&local_48,(QString *)0x4,ba_06);
      local_a8.d.d = (Data *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
      local_a8.d.ptr = local_48.d.ptr;
      local_a8.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_a8);
      QList<QString>::end((QList<QString> *)&local_88);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    tVar4.ptr = local_d0.ptr;
    *(undefined1 *)((long)&((local_d0.ptr)->dirEntry).m_filePath.d.d + 1) = 1;
    ba_07.m_data = psVar5;
    ba_07.m_size = (qsizetype)"QDir::SortFlags(";
    QString::fromUtf8(&local_48,(QString *)0x10,ba_07);
    QTextStream::operator<<((QTextStream *)tVar4.ptr,&local_48);
    piVar3 = (int *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_),2,0x10)
        ;
      }
    }
    if (*(char *)&((local_d0.ptr)->dirEntry).m_filePath.d.d == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d0.ptr,' ');
    }
    begin = local_68.d.ptr;
    if ((QChar *)local_68.d.ptr == (QChar *)0x0) {
      begin = &QString::_empty;
    }
    QDebug::putString((QDebug *)&local_d0,(QChar *)begin,local_68.d.size);
    if (*(char *)&((local_d0.ptr)->dirEntry).m_filePath.d.d == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d0.ptr,' ');
    }
    QTextStream::operator<<((QTextStream *)local_d0.ptr,'|');
    if (*(char *)&((local_d0.ptr)->dirEntry).m_filePath.d.d == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d0.ptr,' ');
    }
    local_a8.d.d = (Data *)CONCAT62(local_a8.d.d._2_6_,0x7c);
    QtPrivate::QStringList_join(&local_48,(QStringList *)&local_88,(QChar *)&local_a8,1);
    if ((QChar *)local_48.d.ptr == (QChar *)0x0) {
      local_48.d.ptr = &QString::_empty;
    }
    QDebug::putString((QDebug *)&local_d0,(QChar *)local_48.d.ptr,local_48.d.size);
    if (*(char *)&((local_d0.ptr)->dirEntry).m_filePath.d.d == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d0.ptr,' ');
    }
    QTextStream::operator<<((QTextStream *)local_d0.ptr,')');
    if (*(char *)&((local_d0.ptr)->dirEntry).m_filePath.d.d == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d0.ptr,' ');
    }
    piVar3 = (int *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT62(local_48.d.d._2_6_,local_48.d.d._0_2_),2,0x10)
        ;
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  tVar4.ptr = local_d0.ptr;
  local_d0.ptr = (QDirPrivate *)0x0;
  local_c8.stream = (Stream *)tVar4.ptr;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  QTextStream::operator<<((QTextStream *)tVar4.ptr,',');
  local_c0.stream = (Stream *)tVar4.ptr;
  if (*(char *)&((tVar4.ptr)->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)tVar4.ptr,' ');
    local_c0.stream = local_c8.stream;
  }
  *(int *)&(((QDirPrivate *)local_c0.stream)->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       *(int *)&(((QDirPrivate *)local_c0.stream)->fileEngine)._M_t.
                super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                ._M_t.
                super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl + 1;
  operator<<((Stream *)&local_b8,(QFlagsStorageHelper<QDir::Filter,_4>)SUB84(&local_c0,0));
  QTextStream::operator<<(&(local_b8.stream)->ts,')');
  if ((local_b8.stream)->space == true) {
    QTextStream::operator<<(&(local_b8.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_b8);
  QDebug::~QDebug(&local_c0);
  QDebug::~QDebug(&local_c8);
  QDebug::~QDebug((QDebug *)&local_d0);
  if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_118);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = (dir->d_ptr).d.ptr;
  (dir->d_ptr).d.ptr = (QDirPrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar6;
  QDebugStateSaver::~QDebugStateSaver(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QDir &dir)
{
    QDebugStateSaver save(debug);
    debug.resetFormat();
    debug << "QDir(" << dir.path() << ", nameFilters = {"
          << dir.nameFilters().join(u',')
          << "}, "
          << dir.sorting()
          << ','
          << dir.filter()
          << ')';
    return debug;
}